

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

int Io_MvParseLineSubckt(Io_MvMod_t *p,char *pLine)

{
  Vec_Ptr_t *vTokens_00;
  Io_MvMan_t *pIVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  Abc_Ntk_t *pNtk;
  void **ppvVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  long lVar10;
  char **local_d8;
  Abc_Obj_t *pNode;
  int k;
  int i;
  int Last;
  int nEquals;
  char **ppNames;
  char *pName2;
  char *pName;
  char *pToken;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pBox;
  Abc_Ntk_t *pModel;
  Vec_Ptr_t *vTokens;
  char *pLine_local;
  Io_MvMod_t *p_local;
  
  vTokens_00 = p->pMan->vTokens;
  iVar3 = Io_MvCountChars(pLine,'=');
  Io_MvSplitIntoTokensAndClear(vTokens_00,pLine,'\0','=');
  pcVar6 = (char *)Vec_PtrEntry(vTokens_00,0);
  iVar4 = strcmp(pcVar6,"subckt");
  if (iVar4 != 0) {
    __assert_fail("!strcmp(pToken, \"subckt\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlifMv.c"
                  ,0x550,"int Io_MvParseLineSubckt(Io_MvMod_t *, char *)");
  }
  pcVar6 = (char *)Vec_PtrEntry(vTokens_00,1);
  pName = pcVar6;
  do {
    if (*pName == '\0') {
LAB_00add8f8:
      pNtk = Abc_DesFindModelByName(p->pMan->pDesign,pcVar6);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pIVar1 = p->pMan;
        uVar5 = Io_MvGetLine(p->pMan,pName);
        sprintf(pIVar1->sError,"Line %d: Cannot find the model for subcircuit %s.",(ulong)uVar5,
                pcVar6);
        p_local._4_4_ = 0;
      }
      else {
        ppvVar7 = Vec_PtrArray(vTokens_00);
        lVar10 = (long)p->pMan->fBlifMv;
        iVar4 = Abc_NtkHasBlackbox(pNtk);
        if (iVar4 == 0) {
          pNet = Abc_NtkCreateWhitebox(p->pNtk);
        }
        else {
          pNet = Abc_NtkCreateBlackbox(p->pNtk);
        }
        *(Abc_Ntk_t **)&(pNet->field_5).iData = pNtk;
        if (p->pMan->fBlifMv != 0) {
          pcVar6 = (char *)Vec_PtrEntry(vTokens_00,2);
          Abc_ObjAssignName(pNet,pcVar6,(char *)0x0);
        }
        k = 0;
        for (pNode._4_4_ = 0; iVar4 = Abc_NtkPiNum(pNtk), pNode._4_4_ < iVar4;
            pNode._4_4_ = pNode._4_4_ + 1) {
          pAVar8 = Abc_NtkPi(pNtk,pNode._4_4_);
          ppNames = (char **)0x0;
          pAVar8 = Abc_ObjFanout0(pAVar8);
          pcVar6 = Abc_ObjName(pAVar8);
          for (pNode._0_4_ = 0; (int)pNode < iVar3; pNode._0_4_ = (int)pNode + 1) {
            iVar4 = strcmp((char *)ppvVar7[lVar10 + (long)(((int)pNode + k) % iVar3 << 1) + 2],
                           pcVar6);
            if (iVar4 == 0) {
              ppNames = (char **)ppvVar7[lVar10 + (long)((((int)pNode + k) % iVar3) * 2 + 1) + 2];
              k = (int)pNode + k + 1;
              break;
            }
          }
          if (ppNames == (char **)0x0) {
            pAVar8 = Abc_NtkCreateNodeConst0(p->pNtk);
            pAVar2 = p->pNtk;
            pcVar6 = Abc_ObjNameSuffix(pAVar8,"abc");
            pAVar9 = Abc_NtkFindOrCreateNet(pAVar2,pcVar6);
            Abc_ObjAddFanin(pAVar9,pAVar8);
            pAVar8 = Abc_NtkCreateBi(p->pNtk);
            Abc_ObjAddFanin(pNet,pAVar8);
            Abc_ObjAddFanin(pAVar8,pAVar9);
          }
          else {
            if (ppNames == (char **)0x0) {
              __assert_fail("pName2 != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlifMv.c"
                            ,0x598,"int Io_MvParseLineSubckt(Io_MvMod_t *, char *)");
            }
            pAVar8 = Abc_NtkFindOrCreateNet(p->pNtk,(char *)ppNames);
            pAVar9 = Abc_NtkCreateBi(p->pNtk);
            Abc_ObjAddFanin(pNet,pAVar9);
            Abc_ObjAddFanin(pAVar9,pAVar8);
          }
        }
        k = 0;
        for (pNode._4_4_ = 0; iVar4 = Abc_NtkPoNum(pNtk), pNode._4_4_ < iVar4;
            pNode._4_4_ = pNode._4_4_ + 1) {
          pAVar8 = Abc_NtkPo(pNtk,pNode._4_4_);
          ppNames = (char **)0x0;
          pAVar8 = Abc_ObjFanin0(pAVar8);
          pcVar6 = Abc_ObjName(pAVar8);
          for (pNode._0_4_ = 0; (int)pNode < iVar3; pNode._0_4_ = (int)pNode + 1) {
            iVar4 = strcmp((char *)ppvVar7[lVar10 + (long)(((int)pNode + k) % iVar3 << 1) + 2],
                           pcVar6);
            if (iVar4 == 0) {
              ppNames = (char **)ppvVar7[lVar10 + (long)((((int)pNode + k) % iVar3) * 2 + 1) + 2];
              k = (int)pNode + k + 1;
              break;
            }
          }
          pAVar8 = Abc_NtkCreateBo(p->pNtk);
          pAVar2 = p->pNtk;
          if (ppNames == (char **)0x0) {
            local_d8 = (char **)Abc_ObjNameSuffix(pAVar8,"abc");
          }
          else {
            local_d8 = ppNames;
          }
          pAVar9 = Abc_NtkFindOrCreateNet(pAVar2,(char *)local_d8);
          Abc_ObjAddFanin(pAVar9,pAVar8);
          Abc_ObjAddFanin(pAVar8,pNet);
        }
        p_local._4_4_ = 1;
      }
      return p_local._4_4_;
    }
    if (*pName == '|') {
      *pName = '\0';
      goto LAB_00add8f8;
    }
    pName = pName + 1;
  } while( true );
}

Assistant:

static int Io_MvParseLineSubckt( Io_MvMod_t * p, char * pLine )
{
    Vec_Ptr_t * vTokens = p->pMan->vTokens;
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pBox, * pNet, * pTerm;
    char * pToken, * pName, * pName2, ** ppNames;
    int nEquals, Last, i, k;

    // split the line into tokens
    nEquals = Io_MvCountChars( pLine, '=' );
    Io_MvSplitIntoTokensAndClear( vTokens, pLine, '\0', '=' );
    pToken = (char *)Vec_PtrEntry(vTokens,0);
    assert( !strcmp(pToken, "subckt") );
//printf( "%d ", nEquals );

    // get the model for this box
    pName = (char *)Vec_PtrEntry(vTokens,1);
    // skip instance name for now
    for ( pToken = pName; *pToken; pToken++ )
        if ( *pToken == '|' )
        {
            *pToken = 0;
            break;
        }
    // find the model
    pModel = Abc_DesFindModelByName( p->pMan->pDesign, pName );
    if ( pModel == NULL )
    {
        sprintf( p->pMan->sError, "Line %d: Cannot find the model for subcircuit %s.", Io_MvGetLine(p->pMan, pToken), pName );
        return 0;
    }
/*
    // check if the number of tokens is correct
    if ( nEquals != Abc_NtkPiNum(pModel) + Abc_NtkPoNum(pModel) )
    {
        sprintf( p->pMan->sError, "Line %d: The number of ports (%d) in .subckt differs from the sum of PIs and POs of the model (%d).", 
            Io_MvGetLine(p->pMan, pToken), nEquals, Abc_NtkPiNum(pModel) + Abc_NtkPoNum(pModel) );
        return 0;
    }
*/
    // get the names
    ppNames = (char **)Vec_PtrArray(vTokens) + 2 + p->pMan->fBlifMv;

    // create the box with these terminals
    if ( Abc_NtkHasBlackbox(pModel) )
        pBox = Abc_NtkCreateBlackbox( p->pNtk );
    else
        pBox = Abc_NtkCreateWhitebox( p->pNtk );
    pBox->pData = pModel;
    if ( p->pMan->fBlifMv )
        Abc_ObjAssignName( pBox, (char *)Vec_PtrEntry(vTokens,2), NULL );
    // go through formal inputs
    Last = 0;
    Abc_NtkForEachPi( pModel, pTerm, i )
    { 
        // find this terminal among the actual inputs of the subcircuit
        pName2 = NULL;
        pName = Abc_ObjName(Abc_ObjFanout0(pTerm));
        for ( k = 0; k < nEquals; k++ )
            if ( !strcmp( ppNames[2*((k+Last)%nEquals)], pName ) )
            {
                pName2 = ppNames[2*((k+Last)%nEquals)+1];
                Last = k+Last+1;
                break;
            }
/*
        if ( k == nEquals )
        {
            sprintf( p->pMan->sError, "Line %d: Cannot find PI \"%s\" of the model \"%s\" as a formal input of the subcircuit.", 
                Io_MvGetLine(p->pMan, pToken), pName, Abc_NtkName(pModel) );
            return 0;
        }
*/
        if ( pName2 == NULL )
        {
            Abc_Obj_t * pNode = Abc_NtkCreateNodeConst0( p->pNtk );
            //pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pNtk->pManFunc, " 0\n" );
            pNet = Abc_NtkFindOrCreateNet( p->pNtk, Abc_ObjNameSuffix(pNode, "abc") );
            Abc_ObjAddFanin( pNet, pNode );
            pTerm = Abc_NtkCreateBi( p->pNtk );
            Abc_ObjAddFanin( pBox, pTerm );
            Abc_ObjAddFanin( pTerm, pNet );
            continue;
        }
        assert( pName2 != NULL );
  
        // create the BI with the actual name
        pNet = Abc_NtkFindOrCreateNet( p->pNtk, pName2 );
        pTerm = Abc_NtkCreateBi( p->pNtk );
        Abc_ObjAddFanin( pBox, pTerm );
        Abc_ObjAddFanin( pTerm, pNet );
    }
    // go through formal outputs
    Last = 0;
    Abc_NtkForEachPo( pModel, pTerm, i )
    {
        // find this terminal among the actual outputs of the subcircuit
        pName2 = NULL;
        pName = Abc_ObjName(Abc_ObjFanin0(pTerm));
        for ( k = 0; k < nEquals; k++ )
            if ( !strcmp( ppNames[2*((k+Last)%nEquals)], pName ) )
            {
                pName2 = ppNames[2*((k+Last)%nEquals)+1];
                Last = k+Last+1;
                break;
            }
/*
        if ( k == nEquals )
        {
            sprintf( p->pMan->sError, "Line %d: Cannot find PO \"%s\" of the modell \"%s\" as a formal output of the subcircuit.", 
                Io_MvGetLine(p->pMan, pToken), pName, Abc_NtkName(pModel) );
            return 0;
        }
*/

        // create the BI with the actual name
        pTerm = Abc_NtkCreateBo( p->pNtk );
        pNet = Abc_NtkFindOrCreateNet( p->pNtk, pName2 == NULL  ? Abc_ObjNameSuffix(pTerm, "abc") : pName2 );
        Abc_ObjAddFanin( pNet, pTerm );
        Abc_ObjAddFanin( pTerm, pBox );
    }
    return 1;
}